

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O2

int consumesInput(Node *node)

{
  Node *pNVar1;
  int iVar2;
  Node **ppNVar3;
  bool bVar4;
  
  do {
    if (node == (Node *)0x0) {
      return 0;
    }
    switch(node->type) {
    case 1:
      if (((node->rule).flags & 2U) != 0) {
        fprintf(_stderr,"possible infinite left recursion in rule \'%s\'\n",(node->rule).name);
        return 0;
      }
      (node->rule).flags = (node->rule).flags | 2;
      iVar2 = consumesInput((node->rule).expression);
      *(byte *)&(node->rule).flags = (byte)(node->rule).flags & 0xfd;
      return iVar2;
    default:
      fprintf(_stderr,"\nconsumesInput: illegal node type %d\n");
      exit(1);
    case 3:
    case 0x10:
      node = (Node *)(node->rule).name;
      break;
    case 4:
    case 7:
      return 1;
    case 5:
    case 6:
      bVar4 = *(node->rule).name == '\0';
      goto LAB_00104732;
    case 8:
    case 9:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      return 0;
    case 10:
      ppNVar3 = &(node->name).rule;
      goto LAB_001046d0;
    case 0xb:
      ppNVar3 = &(node->name).rule;
      goto LAB_00104715;
    }
  } while( true );
  while( true ) {
    iVar2 = consumesInput(pNVar1);
    ppNVar3 = &(pNVar1->rule).next;
    if (iVar2 != 0) break;
LAB_00104715:
    pNVar1 = *ppNVar3;
    if (pNVar1 == (Node *)0x0) break;
  }
  bVar4 = pNVar1 == (Node *)0x0;
LAB_00104732:
  return (uint)!bVar4;
  while( true ) {
    iVar2 = consumesInput(pNVar1);
    ppNVar3 = &(pNVar1->rule).next;
    if (iVar2 == 0) break;
LAB_001046d0:
    pNVar1 = *ppNVar3;
    if (pNVar1 == (Node *)0x0) break;
  }
  return (uint)(pNVar1 == (Node *)0x0);
}

Assistant:

int consumesInput(Node *node)
{
  if (!node) return 0;

  switch (node->type)
    {
    case Rule:
      {
        int result= 0;
        if (RuleReached & node->rule.flags)
          fprintf(stderr, "possible infinite left recursion in rule '%s'\n", node->rule.name);
        else
          {
            node->rule.flags |= RuleReached;
            result= consumesInput(node->rule.expression);
            node->rule.flags &= ~RuleReached;
          }
        return result;
      }
      break;

    case Dot:           return 1;
    case Name:          return consumesInput(node->name.rule);
    case Character:
    case String:        return strlen(node->string.value) > 0;
    case Class:         return 1;
    case Action:        return 0;
    case Predicate:     return 0;

    case Alternate:
      {
        Node *n;
        for (n= node->alternate.first;  n;  n= n->alternate.next)
          if (!consumesInput(n))
            return 0;
      }
      return 1;

    case Sequence:
      {
        Node *n;
        for (n= node->alternate.first;  n;  n= n->alternate.next)
          if (consumesInput(n))
            return 1;
      }
      return 0;

    case PeekFor:       return 0;
    case PeekNot:       return 0;
    case Query:         return 0;
    case Star:          return 0;
    case Plus:          return consumesInput(node->plus.element);

    default:
      fprintf(stderr, "\nconsumesInput: illegal node type %d\n", node->type);
      exit(1);
    }
  return 0;
}